

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finalize.c
# Opt level: O2

void run_in_store(wasm_store_t *store)

{
  FILE *__stream;
  size_t sVar1;
  long lVar2;
  long lVar3;
  char *__s;
  ulong uVar4;
  wasm_byte_vec_t binary;
  wasm_extern_vec_t imports;
  
  puts("Loading binary...");
  __stream = fopen("finalize.wasm","rb");
  if (__stream == (FILE *)0x0) {
LAB_00101416:
    __s = "> Error loading module!";
  }
  else {
    fseek(__stream,0,2);
    sVar1 = ftell(__stream);
    fseek(__stream,0,0);
    wasm_byte_vec_new_uninitialized(&binary,sVar1);
    sVar1 = fread(binary.data,sVar1,1,__stream);
    if (sVar1 != 1) goto LAB_00101416;
    fclose(__stream);
    puts("Compiling module...");
    lVar2 = wasm_module_new(store,&binary);
    if (lVar2 != 0) {
      wasm_byte_vec_delete(&binary);
      puts("Instantiating modules...");
      uVar4 = 0;
      while( true ) {
        if (uVar4 == 0x186a1) {
          wasm_module_delete(lVar2);
          return;
        }
        if ((int)((uVar4 & 0xffffffff) / 10000) * -10000 + (int)uVar4 == 0) {
          printf("%d\n",uVar4 & 0xffffffff);
        }
        imports.size = 0;
        imports.data = (wasm_extern_t **)0x0;
        lVar3 = wasm_instance_new(store,lVar2,&imports,0);
        if (lVar3 == 0) break;
        wasm_instance_set_host_info_with_finalizer(lVar3,uVar4,finalize);
        wasm_instance_delete(lVar3);
        live_count = live_count + 1;
        uVar4 = uVar4 + 1;
      }
      printf("> Error instantiating module %d!\n",uVar4 & 0xffffffff);
      goto LAB_0010140e;
    }
    __s = "> Error compiling module!";
  }
  puts(__s);
LAB_0010140e:
  exit(1);
}

Assistant:

void run_in_store(wasm_store_t* store) {
  // Load binary.
  printf("Loading binary...\n");
  FILE* file = fopen("finalize.wasm", "rb");
  if (!file) {
    printf("> Error loading module!\n");
    exit(1);
  }
  fseek(file, 0L, SEEK_END);
  size_t file_size = ftell(file);
  fseek(file, 0L, SEEK_SET);
  wasm_byte_vec_t binary;
  wasm_byte_vec_new_uninitialized(&binary, file_size);
  if (fread(binary.data, file_size, 1, file) != 1) {
    printf("> Error loading module!\n");
    exit(1);
  }
  fclose(file);

  // Compile.
  printf("Compiling module...\n");
  own wasm_module_t* module = wasm_module_new(store, &binary);
  if (!module) {
    printf("> Error compiling module!\n");
    exit(1);
  }

  wasm_byte_vec_delete(&binary);

  // Instantiate.
  printf("Instantiating modules...\n");
  for (int i = 0; i <= iterations; ++i) {
    if (i % (iterations / 10) == 0) printf("%d\n", i);
    wasm_extern_vec_t imports = WASM_EMPTY_VEC;
    own wasm_instance_t* instance =
      wasm_instance_new(store, module, &imports, NULL);
    if (!instance) {
      printf("> Error instantiating module %d!\n", i);
      exit(1);
    }
    void* data = (void*)(intptr_t)i;
    wasm_instance_set_host_info_with_finalizer(instance, data, &finalize);
    wasm_instance_delete(instance);
    ++live_count;
  }

  wasm_module_delete(module);
}